

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

bool __thiscall libtorrent::aux::listen_socket_t::can_route(listen_socket_t *this,address *addr)

{
  sa_family_t sVar1;
  bool bVar2;
  bool bVar3;
  address local_78;
  address_v6 local_58;
  address_v6 local_40;
  
  bVar3 = true;
  if (((this->flags).m_val & 8) != 0) {
    return true;
  }
  sVar1 = (this->local_endpoint).impl_.data_.base.sa_family;
  if ((addr->type_ == ipv4) == (sVar1 == 2)) {
    if (sVar1 == 2) {
LAB_002881c8:
      local_78.ipv4_address_.addr_.s_addr =
           (in4_addr_type)(this->local_endpoint).impl_.data_.v6.sin6_flowinfo;
      local_78.ipv6_address_.addr_.__in6_u._0_8_ = 0;
      local_78.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      local_78.ipv6_address_.scope_id_ = 0;
      local_78.type_ = ipv4;
    }
    else {
      local_78.ipv6_address_.addr_.__in6_u._0_8_ =
           *(undefined8 *)((long)&(this->local_endpoint).impl_.data_ + 8);
      local_78.ipv6_address_.addr_.__in6_u._8_8_ =
           *(undefined8 *)((long)&(this->local_endpoint).impl_.data_ + 0x10);
      local_78.ipv6_address_.scope_id_ =
           (unsigned_long)(this->local_endpoint).impl_.data_.v6.sin6_scope_id;
      local_78.type_ = ipv6;
      local_78.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
      boost::asio::ip::address::to_v6(&local_40,&local_78);
      boost::asio::ip::address::to_v6(&local_58,addr);
      if (local_40.scope_id_ != local_58.scope_id_) goto LAB_002881bb;
      if ((this->local_endpoint).impl_.data_.base.sa_family == 2) goto LAB_002881c8;
      local_78.type_ = ipv6;
      local_78.ipv6_address_.addr_.__in6_u._0_8_ =
           *(undefined8 *)((long)&(this->local_endpoint).impl_.data_ + 8);
      local_78.ipv6_address_.addr_.__in6_u._8_8_ =
           *(undefined8 *)((long)&(this->local_endpoint).impl_.data_ + 0x10);
      local_78.ipv6_address_.scope_id_ =
           (unsigned_long)(this->local_endpoint).impl_.data_.v6.sin6_scope_id;
      local_78.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
    }
    bVar2 = boost::asio::ip::operator==(&local_78,addr);
    if (!bVar2) {
      bVar2 = (this->local_endpoint).impl_.data_.base.sa_family != 2;
      if (bVar2) {
        local_78.ipv6_address_.addr_.__in6_u._0_8_ =
             *(undefined8 *)((long)&(this->local_endpoint).impl_.data_ + 8);
        local_78.ipv6_address_.addr_.__in6_u._8_8_ =
             *(undefined8 *)((long)&(this->local_endpoint).impl_.data_ + 0x10);
        local_78.ipv6_address_.scope_id_ =
             (unsigned_long)(this->local_endpoint).impl_.data_.v6.sin6_scope_id;
        local_78.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
      }
      else {
        local_78.ipv4_address_.addr_.s_addr =
             (in4_addr_type)(this->local_endpoint).impl_.data_.v6.sin6_flowinfo;
        local_78.ipv6_address_.addr_.__in6_u._0_8_ = 0;
        local_78.ipv6_address_.addr_.__in6_u._8_8_ = 0;
        local_78.ipv6_address_.scope_id_ = 0;
      }
      local_78.type_ = (uint)bVar2;
      bVar2 = boost::asio::ip::address::is_unspecified(&local_78);
      if (!bVar2) {
        bVar2 = (this->local_endpoint).impl_.data_.base.sa_family != 2;
        if (bVar2) {
          local_78.ipv6_address_.addr_.__in6_u._0_8_ =
               *(undefined8 *)((long)&(this->local_endpoint).impl_.data_ + 8);
          local_78.ipv6_address_.addr_.__in6_u._8_8_ =
               *(undefined8 *)((long)&(this->local_endpoint).impl_.data_ + 0x10);
          local_78.ipv6_address_.scope_id_ =
               (unsigned_long)(this->local_endpoint).impl_.data_.v6.sin6_scope_id;
          local_78.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
        }
        else {
          local_78.ipv4_address_.addr_.s_addr =
               (in4_addr_type)(this->local_endpoint).impl_.data_.v6.sin6_flowinfo;
          local_78.ipv6_address_.addr_.__in6_u._0_8_ = 0;
          local_78.ipv6_address_.addr_.__in6_u._8_8_ = 0;
          local_78.ipv6_address_.scope_id_ = 0;
        }
        local_78.type_ = (uint)bVar2;
        bVar2 = match_addr_mask(addr,&local_78,&this->netmask);
        if (!bVar2) {
          bVar3 = ((this->flags).m_val & 2) == 0;
        }
      }
    }
  }
  else {
LAB_002881bb:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool listen_socket_t::can_route(address const& addr) const
	{
		// if this is a proxy, we assume it can reach everything
		if (flags & proxy) return true;

		if (is_v4(local_endpoint) != addr.is_v4()) return false;

		if (local_endpoint.address().is_v6()
			&& local_endpoint.address().to_v6().scope_id() != addr.to_v6().scope_id())
			return false;

		if (local_endpoint.address() == addr) return true;
		if (local_endpoint.address().is_unspecified()) return true;
		if (match_addr_mask(addr, local_endpoint.address(), netmask)) return true;
		return !(flags & local_network);
	}